

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch.h
# Opt level: O2

Branch * __thiscall testinator::Branch::pushChild(Branch *this,int line,char *file,char *name)

{
  list<testinator::Branch,_std::allocator<testinator::Branch>_> *this_00;
  _List_iterator<testinator::Branch> _Var1;
  int local_24;
  char *local_20;
  char *local_18;
  
  this_00 = &this->m_children;
  local_24 = line;
  local_20 = name;
  local_18 = file;
  _Var1 = ::std::
          __find_if<std::_List_iterator<testinator::Branch>,__gnu_cxx::__ops::_Iter_pred<testinator::Branch::pushChild(int,char_const*,char_const*)::_lambda(testinator::Branch_const&)_1_>>
                    ((this->m_children).
                     super__List_base<testinator::Branch,_std::allocator<testinator::Branch>_>.
                     _M_impl._M_node.super__List_node_base._M_next,this_00,line);
  if (_Var1._M_node == (_List_node_base *)this_00) {
    ::std::__cxx11::list<testinator::Branch,std::allocator<testinator::Branch>>::
    emplace_back<int&,char_const*&,char_const*&>
              ((list<testinator::Branch,std::allocator<testinator::Branch>> *)this_00,&local_24,
               &local_18,&local_20);
    _Var1._M_node =
         (this->m_children).
         super__List_base<testinator::Branch,_std::allocator<testinator::Branch>_>._M_impl._M_node.
         super__List_node_base._M_prev;
  }
  return (Branch *)(_Var1._M_node + 1);
}

Assistant:

Branch& pushChild(int line, const char* file, const char* name)
    {
      auto i = std::find_if(m_children.begin(), m_children.end(),
                            [=] (const Branch& r) { return r.m_id == line; });
      if (i != m_children.end()) return *i;

      m_children.emplace_back(line, file, name);
      return m_children.back();
    }